

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

wchar_t * ON_Font::DefaultFaceName(void)

{
  return L"Regular";
}

Assistant:

const wchar_t* ON_Font::DefaultFaceName()
{
  const wchar_t* s;
#if defined(ON_RUNTIME_WIN)
  s = L"Regular";
#elif defined(ON_RUNTIME_APPLE)
  s = L"Regular";
#else
  s = L"Regular";
#endif
  return s;
}